

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharedRenderingPerfTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::anon_unknown_0::SharedRenderingPerfCase::deinit(SharedRenderingPerfCase *this)

{
  TestContext *this_00;
  size_type sVar1;
  reference ppTVar2;
  Library *pLVar3;
  int local_14;
  int threadNdx;
  SharedRenderingPerfCase *this_local;
  
  local_14 = 0;
  while( true ) {
    sVar1 = std::
            vector<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
            ::size(&this->m_contexts);
    if ((int)sVar1 <= local_14) break;
    ppTVar2 = std::
              vector<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
              ::operator[](&this->m_contexts,(long)local_14);
    this_00 = *ppTVar2;
    if (this_00 != (TestContext *)0x0) {
      TestContext::~TestContext(this_00);
      operator_delete(this_00,0x1ad8);
    }
    ppTVar2 = std::
              vector<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
              ::operator[](&this->m_contexts,(long)local_14);
    *ppTVar2 = (value_type)0x0;
    local_14 = local_14 + 1;
  }
  std::
  vector<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
  ::clear(&this->m_contexts);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear(&this->m_results);
  if (this->m_display != (EGLDisplay)0x0) {
    pLVar3 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
    (*pLVar3->_vptr_Library[0x34])(pLVar3,this->m_display);
    this->m_display = (EGLDisplay)0x0;
  }
  return;
}

Assistant:

void SharedRenderingPerfCase::deinit (void)
{
	// Destroy resources and contexts
	for (int threadNdx = 0; threadNdx < (int)m_contexts.size(); threadNdx++)
	{
		delete m_contexts[threadNdx];
		m_contexts[threadNdx] = DE_NULL;
	}

	m_contexts.clear();
	m_results.clear();

	if (m_display != EGL_NO_DISPLAY)
	{
		m_eglTestCtx.getLibrary().terminate(m_display);
		m_display = EGL_NO_DISPLAY;
	}
}